

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O2

Harris * __thiscall Harris::GaussFilter(Harris *this,Mat *img,int range)

{
  int in_ECX;
  undefined4 in_register_00000014;
  long lVar1;
  int c;
  long lVar2;
  int x;
  int iVar3;
  long lVar4;
  int x_1;
  long lVar5;
  double dVar6;
  float fVar7;
  Mat gaussHelperV;
  long local_80;
  long *local_48;
  
  lVar1 = CONCAT44(in_register_00000014,range);
  cv::Mat::Mat(&gaussHelperV,*(int *)(lVar1 + 8) + in_ECX * -2,*(int *)(lVar1 + 0xc) + in_ECX * -2,5
              );
  lVar4 = (long)in_ECX;
  for (lVar5 = lVar4; lVar5 < *(int *)(lVar1 + 8) - in_ECX; lVar5 = lVar5 + 1) {
    for (lVar2 = lVar4; lVar2 < *(int *)(lVar1 + 0xc) - lVar4; lVar2 = lVar2 + 1) {
      fVar7 = 0.0;
      for (iVar3 = -in_ECX; iVar3 <= in_ECX; iVar3 = iVar3 + 1) {
        dVar6 = exp((double)iVar3 * -0.5 * (double)iVar3);
        fVar7 = fVar7 + (float)(dVar6 * 0.3989422804014327) *
                        *(float *)(**(long **)(lVar1 + 0x48) * (lVar5 - lVar4) +
                                   *(long *)(lVar1 + 0x10) + (lVar2 - lVar4) * 4);
      }
      *(float *)(*local_48 * (lVar5 - lVar4) + local_80 + (lVar2 - lVar4) * 4) = fVar7;
    }
  }
  cv::Mat::Mat(&this->harrisResponses,*(int *)(lVar1 + 8) + in_ECX * -2,
               *(int *)(lVar1 + 0xc) + in_ECX * -2,5);
  for (lVar5 = lVar4; lVar5 < (long)*(int *)(lVar1 + 8) - (long)in_ECX; lVar5 = lVar5 + 1) {
    for (lVar2 = lVar4; lVar2 < (long)*(int *)(lVar1 + 0xc) - (long)in_ECX; lVar2 = lVar2 + 1) {
      fVar7 = 0.0;
      for (iVar3 = -in_ECX; iVar3 <= in_ECX; iVar3 = iVar3 + 1) {
        dVar6 = exp((double)iVar3 * -0.5 * (double)iVar3);
        fVar7 = fVar7 + (float)(dVar6 * 0.3989422804014327) *
                        *(float *)(*local_48 * (lVar5 - lVar4) + local_80 + (lVar2 - lVar4) * 4);
      }
      *(float *)(**(long **)&this->field_0x48 * (lVar5 - lVar4) + *(long *)&this->field_0x10 +
                (lVar2 - lVar4) * 4) = fVar7;
    }
  }
  cv::Mat::~Mat(&gaussHelperV);
  return this;
}

Assistant:

Mat Harris::GaussFilter(Mat& img, int range) {
    // Helper Mats for better time complexity
    Mat gaussHelperV(img.rows-range*2, img.cols-range*2, CV_32F);
    for(int r=range; r<img.rows-range; r++) {
        for(int c=range; c<img.cols-range; c++) {
            float res = 0;

            for(int x = -range; x<=range; x++) {
                float m = 1/sqrt(2*M_PI)*exp(-0.5*x*x);

                res += m * img.at<float>(r-range,c-range);
            }

            gaussHelperV.at<float>(r-range,c-range) = res;
        }
    }

    Mat gauss(img.rows-range*2, img.cols-range*2, CV_32F);
    for(int r=range; r<img.rows-range; r++) {
        for(int c=range; c<img.cols-range; c++) {
            float res = 0;

            for(int x = -range; x<=range; x++) {
                float m = 1/sqrt(2*M_PI)*exp(-0.5*x*x);

                res += m * gaussHelperV.at<float>(r-range,c-range);
            }

            gauss.at<float>(r-range,c-range) = res;
        }
    }

    return gauss;
}